

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O0

void ImNodes::EndSlot(void)

{
  char *pcVar1;
  void *pvVar2;
  undefined8 *puVar3;
  long lVar4;
  ImVec2 IVar5;
  bool bVar6;
  ImGuiID IVar7;
  ImU32 IVar8;
  ImGuiWindow *window;
  ImGuiPayload *pIVar9;
  float fVar10;
  _DragConnectionPayload *drag_data_1;
  ImGuiPayload *payload_1;
  char drag_id_1 [32];
  undefined1 local_90 [8];
  _DragConnectionPayload drag_data;
  char drag_id [32];
  ImGuiPayload *payload;
  ImVec2 IStack_40;
  float x;
  ImVec2 local_38;
  undefined1 local_30 [8];
  ImRect slot_rect;
  _CanvasStateImpl *impl;
  CanvasState *canvas;
  ImGuiStyle *style;
  
  ImGui::GetStyle();
  lVar4 = gCanvas;
  slot_rect.Max = *(ImVec2 *)(gCanvas + 0x98);
  ImGui::EndGroup();
  ImGui::PushID(*(char **)((long)slot_rect.Max + 0x30));
  ImGui::PushID(*(int *)((long)slot_rect.Max + 0x28));
  local_38 = ImGui::GetItemRectMin();
  IStack_40 = ImGui::GetItemRectMax();
  ImRect::ImRect((ImRect *)local_30,&local_38,&stack0xffffffffffffffc0);
  IVar7 = ImGui::GetID(*(char **)((long)slot_rect.Max + 0x30));
  ImGui::ItemAdd((ImRect *)local_30,IVar7,(ImRect *)0x0);
  bVar6 = ImGui::IsMouseClicked(0,false);
  if ((bVar6) && (bVar6 = ImGui::IsItemHovered(0), bVar6)) {
    IVar7 = ImGui::GetID(*(char **)((long)slot_rect.Max + 0x30));
    window = ImGui::GetCurrentWindow();
    ImGui::SetActiveID(IVar7,window);
  }
  bVar6 = ImGui::IsItemActive();
  if ((bVar6) && (bVar6 = ImGui::IsMouseDown(0), !bVar6)) {
    ImGui::ClearActiveID();
  }
  bVar6 = IsInputSlotKind(*(int *)((long)slot_rect.Max + 0x28));
  IVar5 = slot_rect.Max;
  if (bVar6) {
    payload._4_4_ = (float)local_30._0_4_;
  }
  else {
    payload._4_4_ = slot_rect.Min.x;
  }
  pcVar1 = *(char **)((long)slot_rect.Max + 0x30);
  pvVar2 = *(void **)((long)slot_rect.Max + 0x10);
  bVar6 = IsInputSlotKind(*(int *)((long)slot_rect.Max + 0x28));
  IVar8 = MakeSlotDataID("x",pcVar1,pvVar2,bVar6);
  ImGuiStorage::SetFloat((ImGuiStorage *)IVar5,IVar8,payload._4_4_);
  IVar5 = slot_rect.Max;
  pcVar1 = *(char **)((long)slot_rect.Max + 0x30);
  pvVar2 = *(void **)((long)slot_rect.Max + 0x10);
  bVar6 = IsInputSlotKind(*(int *)((long)slot_rect.Max + 0x28));
  IVar8 = MakeSlotDataID("y",pcVar1,pvVar2,bVar6);
  fVar10 = ImRect::GetHeight((ImRect *)local_30);
  ImGuiStorage::SetFloat((ImGuiStorage *)IVar5,IVar8,slot_rect.Min.y - fVar10 / 2.0);
  bVar6 = ImGui::BeginDragDropSource(0);
  if (bVar6) {
    pIVar9 = ImGui::GetDragDropPayload();
    snprintf((char *)&drag_data.slot_kind,0x20,"new-node-connection-%08X");
    if ((pIVar9 == (ImGuiPayload *)0x0) ||
       (bVar6 = ImGuiPayload::IsDataType(pIVar9,(char *)&drag_data.slot_kind), !bVar6)) {
      memset(local_90,0,0x18);
      _DragConnectionPayload::_DragConnectionPayload((_DragConnectionPayload *)local_90);
      local_90 = *(undefined1 (*) [8])((long)slot_rect.Max + 0x10);
      drag_data.slot_title._0_4_ = *(undefined4 *)((long)slot_rect.Max + 0x28);
      drag_data.node_id = *(void **)((long)slot_rect.Max + 0x30);
      ImGui::SetDragDropPayload((char *)&drag_data.slot_kind,local_90,0x18,0);
      *(undefined8 *)((long)slot_rect.Max + 0x40) = 0;
      *(undefined8 *)((long)slot_rect.Max + 0x48) = 0;
      *(undefined8 *)((long)slot_rect.Max + 0x50) = 0;
      *(undefined8 *)((long)slot_rect.Max + 0x58) = 0;
      ImVector<ImNodes::_IgnoreSlot>::clear
                ((ImVector<ImNodes::_IgnoreSlot> *)(*(long *)(lVar4 + 0x98) + 0x98));
    }
    ImGui::TextUnformatted(*(char **)((long)slot_rect.Max + 0x30),(char *)0x0);
    ImGui::EndDragDropSource();
  }
  bVar6 = IsConnectingCompatibleSlot();
  if ((bVar6) && (bVar6 = ImGui::BeginDragDropTarget(), bVar6)) {
    snprintf((char *)&payload_1,0x20,"new-node-connection-%08X",
             (ulong)(uint)-*(int *)((long)slot_rect.Max + 0x28));
    pIVar9 = ImGui::AcceptDragDropPayload((char *)&payload_1,0);
    if (pIVar9 != (ImGuiPayload *)0x0) {
      puVar3 = (undefined8 *)pIVar9->Data;
      bVar6 = IsInputSlotKind(*(int *)((long)slot_rect.Max + 0x28));
      if (bVar6) {
        *(undefined8 *)((long)slot_rect.Max + 0x40) = *(undefined8 *)((long)slot_rect.Max + 0x10);
        *(undefined8 *)((long)slot_rect.Max + 0x48) = *(undefined8 *)((long)slot_rect.Max + 0x30);
        *(undefined8 *)((long)slot_rect.Max + 0x50) = *puVar3;
        *(undefined8 *)((long)slot_rect.Max + 0x58) = puVar3[1];
      }
      else {
        *(undefined8 *)((long)slot_rect.Max + 0x40) = *puVar3;
        *(undefined8 *)((long)slot_rect.Max + 0x48) = puVar3[1];
        *(undefined8 *)((long)slot_rect.Max + 0x50) = *(undefined8 *)((long)slot_rect.Max + 0x10);
        *(undefined8 *)((long)slot_rect.Max + 0x58) = *(undefined8 *)((long)slot_rect.Max + 0x30);
      }
      *(undefined1 *)((long)slot_rect.Max + 0x88) = 1;
      ImVector<ImNodes::_IgnoreSlot>::clear
                ((ImVector<ImNodes::_IgnoreSlot> *)(*(long *)(lVar4 + 0x98) + 0x98));
    }
    ImGui::EndDragDropTarget();
  }
  ImGui::PopID();
  ImGui::PopID();
  return;
}

Assistant:

void EndSlot()
{
    const ImGuiStyle& style = ImGui::GetStyle();
    auto* canvas = gCanvas;
    auto* impl = canvas->_impl;

    ImGui::EndGroup();

    ImGui::PushID(impl->slot.title);
    ImGui::PushID(impl->slot.kind);

    ImRect slot_rect{ImGui::GetItemRectMin(), ImGui::GetItemRectMax()};
    // This here adds extra line between slots because after user renders slot cursor is already past those items.
    // ImGui::ItemSize(slot_rect.GetSize());
    ImGui::ItemAdd(slot_rect, ImGui::GetID(impl->slot.title));

    if (ImGui::IsMouseClicked(0) && ImGui::IsItemHovered())
        ImGui::SetActiveID(ImGui::GetID(impl->slot.title), ImGui::GetCurrentWindow());

    if (ImGui::IsItemActive() && !ImGui::IsMouseDown(0))
        ImGui::ClearActiveID();

    // Store slot edge positions, curves will connect there
    {
        float x;
        if (IsInputSlotKind(impl->slot.kind))
            x = slot_rect.Min.x;
        else
            x = slot_rect.Max.x;

        impl->cached_data.SetFloat(MakeSlotDataID("x", impl->slot.title, impl->node.id, IsInputSlotKind(impl->slot.kind)), x);
        impl->cached_data.SetFloat(MakeSlotDataID("y", impl->slot.title, impl->node.id, IsInputSlotKind(impl->slot.kind)),
            slot_rect.Max.y - slot_rect.GetHeight() / 2);
    }

    if (ImGui::BeginDragDropSource())
    {
        auto* payload = ImGui::GetDragDropPayload();
        char drag_id[32];
        snprintf(drag_id, sizeof(drag_id), "new-node-connection-%08X", impl->slot.kind);
        if (payload == nullptr || !payload->IsDataType(drag_id))
        {
            _DragConnectionPayload drag_data{ };
            drag_data.node_id = impl->node.id;
            drag_data.slot_kind = impl->slot.kind;
            drag_data.slot_title = impl->slot.title;

            ImGui::SetDragDropPayload(drag_id, &drag_data, sizeof(drag_data));

            // Clear new connection info
            impl->new_connection.input_node = nullptr;
            impl->new_connection.input_slot = nullptr;
            impl->new_connection.output_node = nullptr;
            impl->new_connection.output_slot = nullptr;
            canvas->_impl->ignore_connections.clear();
        }
        ImGui::TextUnformatted(impl->slot.title);
        ImGui::EndDragDropSource();
    }

    if (IsConnectingCompatibleSlot() && ImGui::BeginDragDropTarget())
    {
        // Accept drags from opposite type (input <-> output, and same kind)
        char drag_id[32];
        snprintf(drag_id, sizeof(drag_id), "new-node-connection-%08X", impl->slot.kind * -1);

        if (auto* payload = ImGui::AcceptDragDropPayload(drag_id))
        {
            auto* drag_data = (_DragConnectionPayload*) payload->Data;

            // Store info of source slot to be queried by ImNodes::GetConnection()
            if (!IsInputSlotKind(impl->slot.kind))
            {
                impl->new_connection.input_node = drag_data->node_id;
                impl->new_connection.input_slot = drag_data->slot_title;
                impl->new_connection.output_node = impl->node.id;
                impl->new_connection.output_slot = impl->slot.title;
            }
            else
            {
                impl->new_connection.input_node = impl->node.id;
                impl->new_connection.input_slot = impl->slot.title;
                impl->new_connection.output_node = drag_data->node_id;
                impl->new_connection.output_slot = drag_data->slot_title;
            }
            impl->just_connected = true;
            canvas->_impl->ignore_connections.clear();
        }

        ImGui::EndDragDropTarget();
    }

    ImGui::PopID(); // kind
    ImGui::PopID(); // name
}